

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5b8e::BuildSystemCAPI_CustomToolWithDiscoveredDependencies_Test::TestBody
          (BuildSystemCAPI_CustomToolWithDiscoveredDependencies_Test *this)

{
  llb_buildsystem_delegate_t delegate_00;
  llb_buildsystem_invocation_t invocation_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  undefined8 uStackY_818;
  undefined1 in_stack_fffffffffffff7f0 [224];
  AssertHelper in_stack_fffffffffffff900;
  Message local_6f8;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_6c0 [8];
  string outputContentsSecondBuild;
  string local_698;
  string local_678;
  AssertHelper local_658;
  Message local_650;
  undefined1 local_648 [8];
  AssertionResult gtest_ar;
  undefined1 local_618 [8];
  string outputContentsFirstBuild;
  llb_data_t key;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8 [29];
  llb_buildsystem_t *local_4d0;
  llb_buildsystem_t *system;
  llb_buildsystem_delegate_t delegate;
  llb_buildsystem_invocation_t invocation;
  string local_390;
  ostringstream local_370 [8];
  ostringstream buildFileContents;
  undefined1 local_1f8 [8];
  string buildFilePath;
  undefined1 local_1b8 [8];
  string depInfoFilePath;
  undefined1 local_178 [8];
  string outputFilePath;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string directInputFilePath;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string indirectInputFilePath;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string tmpDirPath;
  BuildSystemCAPI_CustomToolWithDiscoveredDependencies_Test *this_local;
  
  bVar7 = 0;
  tmpDirPath.field_2._8_8_ = this;
  llbuild::basic::sys::makeTmpDir_abi_cxx11_();
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    indirectInputFilePath.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1);
    if (*(char *)indirectInputFilePath.field_2._8_8_ == '\\') {
      *(char *)indirectInputFilePath.field_2._8_8_ = '/';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,"/")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_90,"indirect-input-file");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,(string *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"1",(allocator *)(directInputFilePath.field_2._M_local_buf + 0xf));
  writeFileContents(&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(directInputFilePath.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,"/")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 &local_118,"direct-input-file");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_138,(string *)local_f8);
  std::__cxx11::string::string
            ((string *)(outputFilePath.field_2._M_local_buf + 8),(string *)local_70);
  writeFileContents(&local_138,(string *)((long)&outputFilePath.field_2 + 8));
  std::__cxx11::string::~string((string *)(outputFilePath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_138);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&depInfoFilePath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,"/")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&depInfoFilePath.field_2 + 8),"output-file");
  std::__cxx11::string::~string((string *)(depInfoFilePath.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&buildFilePath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,"/")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&buildFilePath.field_2 + 8),"dep-info-file");
  std::__cxx11::string::~string((string *)(buildFilePath.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 "/llbuild");
  std::__cxx11::ostringstream::ostringstream(local_370);
  poVar2 = std::operator<<((ostream *)local_370,"client:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"  name: basic");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_370,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"targets:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"  \"\": [\"<all>\"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_370,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"nodes:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"  \"");
  poVar2 = std::operator<<(poVar2,(string *)local_178);
  poVar2 = std::operator<<(poVar2,"\": {}");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_370,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"commands:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"  \"copy-indirectly|");
  poVar2 = std::operator<<(poVar2,(string *)local_f8);
  poVar2 = std::operator<<(poVar2,"|");
  poVar2 = std::operator<<(poVar2,(string *)local_178);
  poVar2 = std::operator<<(poVar2,"|");
  poVar2 = std::operator<<(poVar2,(string *)local_1b8);
  poVar2 = std::operator<<(poVar2,"\":");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"    tool: custom-depinfo-tester-tool");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"    inputs: [\"");
  poVar2 = std::operator<<(poVar2,(string *)local_f8);
  poVar2 = std::operator<<(poVar2,"\"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"    outputs: [\"");
  poVar2 = std::operator<<(poVar2,(string *)local_178);
  poVar2 = std::operator<<(poVar2,"\", \"");
  poVar2 = std::operator<<(poVar2,(string *)local_1b8);
  poVar2 = std::operator<<(poVar2,"\"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"    deps: \"");
  poVar2 = std::operator<<(poVar2,(string *)local_1b8);
  poVar2 = std::operator<<(poVar2,"\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"  \"<all>\":");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"    tool: phony");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"    inputs: [\"");
  poVar2 = std::operator<<(poVar2,(string *)local_178);
  poVar2 = std::operator<<(poVar2,"\"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_370,"    outputs: [\"<all>\"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)&local_390,(string *)local_1f8);
  std::__cxx11::ostringstream::str();
  writeFileContents(&local_390,(string *)&invocation.schedulerLanes);
  std::__cxx11::string::~string((string *)&invocation.schedulerLanes);
  std::__cxx11::string::~string((string *)&local_390);
  memset(&delegate.should_resolve_cycle,0,0x30);
  delegate.should_resolve_cycle =
       (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
        *)std::__cxx11::string::c_str();
  invocation.environment._1_1_ = 1;
  memset(&system,0,0xe8);
  system = (llb_buildsystem_t *)0x0;
  delegate.fs_create_directory = fs_get_file_contents;
  delegate.fs_remove = fs_get_file_info;
  delegate.fs_create_symlink = lookup_tool;
  delegate.lookup_tool = handle_diagnostic;
  delegate.handle_diagnostic = had_command_failure;
  delegate.should_command_start = command_started;
  delegate.command_started = command_finished;
  delegate.command_finished = command_found_discovered_dependency;
  delegate.cannot_build_node_due_to_multiple_producers = command_process_started;
  delegate.command_process_started = command_process_had_error;
  delegate.command_process_had_error = command_process_had_output;
  delegate.command_process_had_output = command_process_finished;
  memcpy(local_5b8,&system,0xe8);
  memcpy(&key.data,&delegate.should_resolve_cycle,0x30);
  puVar5 = local_5b8;
  puVar6 = &uStackY_818;
  for (lVar4 = 0x1d; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  delegate_00.should_resolve_cycle =
       (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
        *)key.data;
  delegate_00.context = (void *)in_stack_fffffffffffff7f0._0_8_;
  delegate_00.fs_create_directory = (_func_bool_void_ptr_char_ptr *)in_stack_fffffffffffff7f0._8_8_;
  delegate_00.fs_get_file_contents =
       (_func_bool_void_ptr_char_ptr_llb_data_t_ptr *)in_stack_fffffffffffff7f0._16_8_;
  delegate_00.fs_remove = (_func_bool_void_ptr_char_ptr *)in_stack_fffffffffffff7f0._24_8_;
  delegate_00.fs_get_file_info =
       (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)in_stack_fffffffffffff7f0._32_8_;
  delegate_00.fs_get_link_info =
       (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)in_stack_fffffffffffff7f0._40_8_;
  delegate_00.fs_create_symlink =
       (_func_bool_void_ptr_char_ptr_char_ptr *)in_stack_fffffffffffff7f0._48_8_;
  delegate_00.lookup_tool =
       (_func_llb_buildsystem_tool_t_ptr_void_ptr_llb_data_t_ptr *)in_stack_fffffffffffff7f0._56_8_;
  delegate_00.handle_diagnostic =
       (_func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *)
       in_stack_fffffffffffff7f0._64_8_;
  delegate_00.had_command_failure = (_func_void_void_ptr *)in_stack_fffffffffffff7f0._72_8_;
  delegate_00.command_status_changed =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_status_kind_t *)
       in_stack_fffffffffffff7f0._80_8_;
  delegate_00.command_preparing =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)in_stack_fffffffffffff7f0._88_8_;
  delegate_00.should_command_start =
       (_func_bool_void_ptr_llb_buildsystem_command_t_ptr *)in_stack_fffffffffffff7f0._96_8_;
  delegate_00.command_started =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)in_stack_fffffffffffff7f0._104_8_;
  delegate_00.command_finished =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *)
       in_stack_fffffffffffff7f0._112_8_;
  delegate_00.command_found_discovered_dependency =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
        *)in_stack_fffffffffffff7f0._120_8_;
  delegate_00.command_had_error =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)
       in_stack_fffffffffffff7f0._128_8_;
  delegate_00.command_had_note =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)
       in_stack_fffffffffffff7f0._136_8_;
  delegate_00.command_had_warning =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)
       in_stack_fffffffffffff7f0._144_8_;
  delegate_00.command_cannot_build_output_due_to_missing_inputs =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_build_key_t_ptr_ptr_llb_build_key_t_ptr_ptr_uint64_t
        *)in_stack_fffffffffffff7f0._152_8_;
  delegate_00.choose_command_from_multiple_producers =
       (_func_llb_buildsystem_command_t_ptr_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t
        *)in_stack_fffffffffffff7f0._160_8_;
  delegate_00.cannot_build_node_due_to_multiple_producers =
       (_func_void_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t *)
       in_stack_fffffffffffff7f0._168_8_;
  delegate_00.command_process_started =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr *)
       in_stack_fffffffffffff7f0._176_8_;
  delegate_00.command_process_had_error =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
        *)in_stack_fffffffffffff7f0._184_8_;
  delegate_00.command_process_had_output =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
        *)in_stack_fffffffffffff7f0._192_8_;
  delegate_00.command_process_finished =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_buildsystem_command_extended_result_t_ptr
        *)in_stack_fffffffffffff7f0._200_8_;
  delegate_00.determined_rule_needs_to_run =
       (_func_void_void_ptr_llb_build_key_t_ptr_llb_rule_run_reason_t_llb_build_key_t_ptr *)
       in_stack_fffffffffffff7f0._208_8_;
  delegate_00.cycle_detected =
       (_func_void_void_ptr_llb_build_key_t_ptr_ptr_uint64_t *)in_stack_fffffffffffff7f0._216_8_;
  invocation_00.dbPath = (char *)local_5d8;
  invocation_00.buildFilePath = (char *)uStack_5e0;
  invocation_00.traceFilePath = (char *)uStack_5d0;
  invocation_00.environment = (char **)local_5c8;
  invocation_00._32_8_ = uStack_5c0;
  invocation_00._40_8_ = in_stack_fffffffffffff900.data_;
  local_4d0 = llb_buildsystem_create(delegate_00,invocation_00);
  llb_buildsystem_initialize(local_4d0);
  memset((void *)((long)&outputContentsFirstBuild.field_2 + 8),0,0x10);
  printf("initial build:\n");
  bVar1 = llb_buildsystem_build
                    (local_4d0,(llb_data_t *)((long)&outputContentsFirstBuild.field_2 + 8));
  if (!bVar1) {
    printf("build had command failures\n");
  }
  std::__cxx11::string::string((string *)&gtest_ar.message_,(string *)local_178);
  readFileContents((string *)local_618,(string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_648,"outputContentsFirstBuild","\"1\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618,
             (char (*) [2])0x3636f3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/CAPI/BuildSystem-C-API.cpp"
               ,0x17f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
  llbuild::basic::sys::sleep(1);
  std::__cxx11::string::string((string *)&local_678,(string *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_698,"2",
             (allocator *)(outputContentsSecondBuild.field_2._M_local_buf + 0xf));
  writeFileContents(&local_678,&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator
            ((allocator<char> *)(outputContentsSecondBuild.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_678);
  printf("second build:\n");
  bVar1 = llb_buildsystem_build
                    (local_4d0,(llb_data_t *)((long)&outputContentsFirstBuild.field_2 + 8));
  if (!bVar1) {
    printf("build had command failures\n");
  }
  std::__cxx11::string::string((string *)&gtest_ar_1.message_,(string *)local_178);
  readFileContents((string *)local_6c0,(string *)&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_6f0,"outputContentsSecondBuild","\"2\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0,
             (char (*) [2])0x3718b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_6f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/CAPI/BuildSystem-C-API.cpp"
               ,0x191,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffff900,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff900);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  llb_buildsystem_destroy(local_4d0);
  std::__cxx11::string::~string((string *)local_6c0);
  std::__cxx11::string::~string((string *)local_618);
  std::__cxx11::ostringstream::~ostringstream(local_370);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&__range1);
  return;
}

Assistant:

TEST(BuildSystemCAPI, CustomToolWithDiscoveredDependencies) {
  std::string tmpDirPath = llbuild::basic::sys::makeTmpDir();
  for (auto& c : tmpDirPath) {
    if (c == '\\') {
      c = '/';
    }
  }
  // We write out an indirectly referenced file containing data to be copied to
  // the output file.
  std::string indirectInputFilePath = tmpDirPath + "/" + "indirect-input-file";
  writeFileContents(indirectInputFilePath, "1");
  
  // Write out a directly referenced file containing the path of the indirectly
  // referenced file.
  std::string directInputFilePath = tmpDirPath + "/" + "direct-input-file";
  writeFileContents(directInputFilePath, indirectInputFilePath);
  
  // The output file will be written by the tool.
  std::string outputFilePath = tmpDirPath + "/" + "output-file";
  
  // The dependency info file will also be written by the tool.
  std::string depInfoFilePath = tmpDirPath + "/" + "dep-info-file";
  
  // Write out a build manifest containing node definitions and a build rule to
  // use a custom rule to copy the contents of the indirect input file to the
  // output file, via the path in the direct input file.
  std::string buildFilePath = tmpDirPath + "/llbuild";  
  std::ostringstream buildFileContents;
  buildFileContents << "client:" << std::endl;
  buildFileContents << "  name: basic" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "targets:" << std::endl;
  buildFileContents << "  \"\": [\"<all>\"]" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "nodes:" << std::endl;
  buildFileContents << "  \"" << outputFilePath << "\": {}" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "commands:" << std::endl;
  buildFileContents << "  \"copy-indirectly|" << directInputFilePath << "|" << outputFilePath << "|" << depInfoFilePath << "\":" << std::endl;
  buildFileContents << "    tool: custom-depinfo-tester-tool" << std::endl;
  buildFileContents << "    inputs: [\"" << directInputFilePath << "\"]" << std::endl;
  buildFileContents << "    outputs: [\"" << outputFilePath << "\", \"" << depInfoFilePath << "\"]" << std::endl;
  buildFileContents << "    deps: \"" << depInfoFilePath << "\"" << std::endl;
  buildFileContents << "  \"<all>\":" << std::endl;
  buildFileContents << "    tool: phony" << std::endl;
  buildFileContents << "    inputs: [\"" << outputFilePath << "\"]" << std::endl;
  buildFileContents << "    outputs: [\"<all>\"]" << std::endl;
  writeFileContents(buildFilePath, buildFileContents.str());

  // Create an invocation.
  llb_buildsystem_invocation_t invocation = {};
  invocation.buildFilePath = buildFilePath.c_str();
  invocation.useSerialBuild = true;
  
  // Create a build system delegate.
  llb_buildsystem_delegate_t delegate = {};
  delegate.context = NULL;
  delegate.fs_get_file_contents = fs_get_file_contents;
  delegate.fs_get_file_info = fs_get_file_info;
  delegate.lookup_tool = lookup_tool;
  delegate.handle_diagnostic = handle_diagnostic;
  delegate.had_command_failure = had_command_failure;
  delegate.command_started = command_started;
  delegate.command_finished = command_finished;
  delegate.command_found_discovered_dependency = command_found_discovered_dependency;
  delegate.command_process_started = command_process_started;
  delegate.command_process_had_error = command_process_had_error;
  delegate.command_process_had_output = command_process_had_output;
  delegate.command_process_finished = command_process_finished;
  
  // Create a build system.
  llb_buildsystem_t* system = llb_buildsystem_create(delegate, invocation);
  
  // Initialize the system.
  llb_buildsystem_initialize(system);
  
  // Build the default target once.
  llb_data_t key = { 0, NULL };
  printf("initial build:\n");
  if (!llb_buildsystem_build(system, &key)) {
    printf("build had command failures\n");
  }
  
  // Check that the output file was produced and has the expected contents.
  std::string outputContentsFirstBuild = readFileContents(outputFilePath);
  EXPECT_EQ(outputContentsFirstBuild, "1");
  
  // Wait for at least a second because some filesystem only have file mod
  // times on the granularity of a second.
  // FIXME: might be better to just fake the timestamp on the file
  llbuild::basic::sys::sleep(1);

  // Change the contents of the indirect (not the direct) file.
  writeFileContents(indirectInputFilePath, "2");
  
  // Build the target again.
  printf("second build:\n");
  if (!llb_buildsystem_build(system, &key)) {
    printf("build had command failures\n");
  }
  
  // Check that the output file was updated and has the expected contents.
  std::string outputContentsSecondBuild = readFileContents(outputFilePath);
  EXPECT_EQ(outputContentsSecondBuild, "2");
  
  // Destroy the build system.
  llb_buildsystem_destroy(system);
}